

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_setpath(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  char *__s1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  CHAR_DATA *victim;
  char temp [4608];
  char arg1 [4608];
  char *in_stack_ffffffffffffdbd8;
  char *in_stack_ffffffffffffdbe0;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  char local_1218;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  __s1 = one_argument(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  if ((*__s1 == '\0') || (local_1218 == '\0')) {
    send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  }
  else {
    pCVar2 = get_char_world(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    if (pCVar2 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    }
    else {
      iVar1 = strcmp(__s1,"protector");
      if (iVar1 == 0) {
        pCVar2->pcdata->paladin_path = 1;
        group_add(in_stack_ffffffffffffdbf0,(char *)in_stack_ffffffffffffdbe8,
                  SUB81((ulong)pCVar2 >> 0x38,0));
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        sprintf(&stack0xffffffffffffdbe8,"AUTO: %s inducted them into Protector path.\n\r",
                in_RDI->true_name);
      }
      else {
        iVar1 = strcmp(__s1,"crusader");
        if (iVar1 != 0) {
          send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
          return;
        }
        pCVar2->pcdata->paladin_path = 2;
        group_add(in_stack_ffffffffffffdbf0,(char *)in_stack_ffffffffffffdbe8,
                  SUB81((ulong)pCVar2 >> 0x38,0));
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        sprintf(&stack0xffffffffffffdbe8,"AUTO: %s inducted them into Crusader path.\n\r",
                in_RDI->true_name);
      }
      add_history(unaff_retaddr,in_RDI,__s1);
    }
  }
  return;
}

Assistant:

void do_setpath(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], temp[MSL];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg1);

	if (argument[0] == '\0' || arg1[0] == '\0')
	{
		send_to_char("Syntax: setpath <character> <protector/crusader>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("You cannot find that person.\n\r", ch);
		return;
	}

	if (!strcmp(argument, "protector"))
	{
		victim->pcdata->paladin_path = PALADIN_PROTECTOR;

		group_add(victim, "protector", false);

		send_to_char("You have set that character's path to Protector.\n\r", ch);
		send_to_char("Your path has been set, you will follow that of the Protector of Shalar.\n\r", victim);

		sprintf(temp, "AUTO: %s inducted them into Protector path.\n\r", ch->true_name);
	}
	else if (!strcmp(argument, "crusader"))
	{
		victim->pcdata->paladin_path = PALADIN_CRUSADER;

		group_add(victim, "crusader", false);

		send_to_char("You have set that character's path to Crusader.\n\r", ch);
		send_to_char("Your path has been set, you will follow that of the Crusader of Shalar.\n\r", victim);

		sprintf(temp, "AUTO: %s inducted them into Crusader path.\n\r", ch->true_name);
	}
	else
	{
		send_to_char("That's not a paladin path.\n\r", ch);
		return;
	}
	
	add_history(nullptr, victim, temp);
}